

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_STRING::OEqual(_Type_STRING *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  char32_t c;
  Object *pOVar2;
  Type *pTVar3;
  Character *this_00;
  String *pSVar4;
  String *string;
  bool *pbVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar6;
  Variable VVar7;
  String local_60;
  undefined1 local_29;
  Variable *local_28;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_STRING *this_local;
  Variable *res;
  
  local_28 = (Variable *)CONCAT71(in_register_00000009,in_CL);
  local_29 = 0;
  obj2_local = obj2;
  obj1_local = obj1;
  this_local = this;
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->(local_28);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  if (bVar1) {
    pOVar2 = Variable::operator->(local_28);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)_type_character);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2_local);
      pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
      pOVar2 = Variable::operator->(local_28);
      this_00 = Object::GetData<LiteScript::Character>(pOVar2);
      c = Character::operator_cast_to_char32_t(this_00);
      String::String(&local_60,c);
      bVar1 = String::operator==(pSVar4,&local_60);
      pOVar2 = Variable::operator->((Variable *)this);
      pbVar5 = Object::GetData<bool>(pOVar2);
      *pbVar5 = bVar1;
      String::~String(&local_60);
      puVar6 = extraout_RDX;
    }
    else {
      pOVar2 = Variable::operator->((Variable *)this);
      pbVar5 = Object::GetData<bool>(pOVar2);
      *pbVar5 = false;
      puVar6 = extraout_RDX_00;
    }
  }
  else {
    pOVar2 = Variable::operator->(obj2_local);
    pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->(local_28);
    string = Object::GetData<LiteScript::String>(pOVar2);
    bVar1 = String::operator==(pSVar4,string);
    pOVar2 = Variable::operator->((Variable *)this);
    pbVar5 = Object::GetData<bool>(pOVar2);
    *pbVar5 = bVar1;
    puVar6 = extraout_RDX_01;
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this) {
        if (obj2->GetType() == _type_character)
            res->GetData<bool>() = (obj1->GetData<String>() == String((char32_t)obj2->GetData<Character>()));
        else
            res->GetData<bool>() = false;
    }
    else
        res->GetData<bool>() = (obj1->GetData<String>() == obj2->GetData<String>());
    return res;
}